

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_range_vector.hpp
# Opt level: O0

vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_> *
__thiscall
burst::make_range_vector_t::operator()
          (vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>
           *__return_storage_ptr__,make_range_vector_t *this,initializer_list<int> *collections,
          initializer_list<int> *collections_1)

{
  initializer_list<boost::iterator_range<const_int_*>_> values;
  iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> local_58;
  iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag> local_48;
  iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *local_38;
  undefined8 local_30;
  initializer_list<int> *local_28;
  initializer_list<int> *collections_local_1;
  initializer_list<int> *collections_local;
  make_range_vector_t *this_local;
  
  local_28 = collections_1;
  collections_local_1 = collections;
  collections_local = (initializer_list<int> *)this;
  this_local = (make_range_vector_t *)__return_storage_ptr__;
  local_58 = (iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>)
             boost::make_iterator_range<std::initializer_list<int>>(collections);
  local_48.super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
  super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> =
       (iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>)
       boost::make_iterator_range<std::initializer_list<int>>(local_28);
  local_38 = &local_58;
  local_30 = 2;
  values._M_len = (size_type)collections_1;
  values._M_array = (iterator)0x2;
  make_vector<boost::iterator_range<int_const*>>(__return_storage_ptr__,(burst *)local_38,values);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Collections & ... collections) const
        {
            return make_vector({boost::make_iterator_range(collections)...});
        }